

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hh
# Opt level: O2

V2f __thiscall anon_unknown.dwarf_5aeb::WorldState::CursorUV(WorldState *this,double x,double y)

{
  float fVar1;
  float fVar8;
  undefined8 in_XMM0_Qb;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  float fVar7;
  float fVar9;
  undefined1 auVar6 [16];
  undefined1 auVar10 [16];
  undefined1 auVar4 [16];
  
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = x;
  auVar2._4_12_ = auVar5._4_12_;
  auVar2._0_4_ = (float)x;
  auVar10._0_4_ = (float)(int)_ws;
  auVar10._4_4_ = (float)(int)((ulong)_ws >> 0x20);
  auVar10._8_8_ = 0;
  auVar4._0_8_ = auVar2._0_8_;
  auVar4._8_4_ = (int)((ulong)x >> 0x20);
  auVar4._12_4_ = auVar10._4_4_;
  auVar3._8_8_ = auVar4._8_8_;
  auVar3._4_4_ = auVar10._4_4_ - (float)y;
  auVar3._0_4_ = auVar2._0_4_;
  auVar5 = divps(auVar3,auVar10);
  fVar1 = auVar5._0_4_ + -0.5;
  fVar7 = auVar5._4_4_ + -0.5;
  fVar8 = auVar5._8_4_ + 0.0;
  fVar9 = auVar5._12_4_ + 0.0;
  auVar6._0_4_ = fVar1 + fVar1;
  auVar6._4_4_ = fVar7 + fVar7;
  auVar6._8_4_ = fVar8 + fVar8;
  auVar6._12_4_ = fVar9 + fVar9;
  auVar5 = minps(_DAT_0011e060,auVar6);
  return (_Type)(CONCAT44(~-(uint)(auVar6._4_4_ < -1.0) & auVar5._4_4_,
                          ~-(uint)(auVar6._0_4_ < -1.0) & auVar5._0_4_) |
                CONCAT44(-(uint)(auVar6._4_4_ < -1.0),-(uint)(auVar6._0_4_ < -1.0)) &
                0xbf800000bf800000);
}

Assistant:

auto CursorUV(double x, double y) const -> V2f { // shitty glfw interface
    auto xx = static_cast<float>(x);
    auto yy = static_cast<float>(y);
    return {std::clamp(2 * (xx / win_sz[0] - .5f), -1.f, 1.f),
            std::clamp(2 * ((win_sz[1] - yy) / win_sz[1] - .5f), -1.f, 1.f)};
  }